

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O3

JavascriptString * __thiscall Js::RuntimeFunction::EnsureSourceString(RuntimeFunction *this)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  JavascriptString *pJVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 *puVar7;
  ulong uVar8;
  PropertyString *name;
  char *message;
  char *error;
  uint lineNumber;
  ScriptContext *pSVar9;
  Var pvVar10;
  Type *addr;
  JavascriptString *local_48;
  JavascriptString *functionName;
  Type *local_38;
  
  pvVar10 = (this->functionNameId).ptr;
  if (this->isDisplayString == true) {
    pJVar5 = VarTo<Js::JavascriptString>(pvVar10);
    return pJVar5;
  }
  pJVar1 = (((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr;
  addr = &this->functionNameId;
  if (pvVar10 == (Var)0x0) {
    pJVar5 = StringCache::GetFunctionDisplay(&pJVar1->stringCache);
    goto LAB_00d45fb0;
  }
  pSVar9 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x4d])(pDVar6);
  if (iVar4 != 0) {
    local_48 = (JavascriptString *)0x0;
    bVar3 = JavascriptFunction::GetFunctionName(&this->super_JavascriptFunction,&local_48);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                  ,0x2a,"(status)","status");
      if (!bVar3) goto LAB_00d45fda;
      *puVar7 = 0;
    }
    (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (this,0x106,local_48,2,0,0,0xf);
  }
  pvVar10 = addr->ptr;
  uVar8 = (ulong)pvVar10 & 0x1ffff00000000;
  functionName = (JavascriptString *)pSVar9;
  local_38 = addr;
  if (uVar8 == 0x1000000000000 || ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d45ed4;
    name = (PropertyString *)VarTo<Js::JavascriptString>(pvVar10);
    pSVar9 = (ScriptContext *)functionName;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d45fda;
    *puVar7 = 0;
    pvVar10 = local_38->ptr;
    uVar8 = (ulong)pvVar10 & 0x1ffff00000000;
LAB_00d45ed4:
    if (uVar8 == 0x1000000000000 || ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        error = "(Is(aValue))";
        message = "Ensure var is actually a \'TaggedInt\'";
        lineNumber = 0x43;
        goto LAB_00d45f70;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00d45f70:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,lineNumber,error,message);
      if (!bVar3) {
LAB_00d45fda:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pSVar9 = (ScriptContext *)functionName;
    name = ScriptContext::GetPropertyString((ScriptContext *)functionName,(PropertyId)pvVar10);
  }
  pJVar5 = JavascriptFunction::GetNativeFunctionDisplayString(pSVar9,&name->super_JavascriptString);
  addr = local_38;
LAB_00d45fb0:
  Memory::Recycler::WBSetBit((char *)addr);
  (this->functionNameId).ptr = pJVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->isDisplayString = true;
  return pJVar5;
}

Assistant:

JavascriptString *
    RuntimeFunction::EnsureSourceString()
    {
        JavascriptLibrary* library = this->GetLibrary();
        ScriptContext * scriptContext = library->GetScriptContext();
        JavascriptString * retStr = nullptr;
        if (this->isDisplayString)
        {
            return VarTo<JavascriptString>(this->functionNameId);
        }

        if (this->functionNameId == nullptr)
        {
            retStr = library->GetFunctionDisplayString();
        }
        else
        {
            if (this->GetTypeHandler()->IsDeferredTypeHandler())
            {
                JavascriptString* functionName = nullptr;
                DebugOnly(bool status = ) this->GetFunctionName(&functionName);
                Assert(status);
                this->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
            if (TaggedInt::Is(this->functionNameId))
            {
                // This has a side-effect where any other code (such as debugger) that uses functionNameId value will now get the value like "function foo() { native code }"
                // instead of just "foo". Alternative ways will need to be devised; if it's not desirable to use this full display name value in those cases.
                retStr = GetNativeFunctionDisplayString(scriptContext, scriptContext->GetPropertyString(TaggedInt::ToInt32(this->functionNameId)));
            }
            else
            {
                retStr = GetNativeFunctionDisplayString(scriptContext, VarTo<JavascriptString>(this->functionNameId));
            }
        }

        this->functionNameId = retStr;
        this->isDisplayString = true;

        return retStr;
    }